

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O2

string * __thiscall
VvcVpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,VvcVpsUnit *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  allocator<char> local_39;
  string local_38;
  double fps;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Frame rate: ",(allocator<char> *)&local_38);
  uVar1 = this->num_units_in_tick;
  uVar2 = this->time_scale;
  fps = 0.0;
  if (uVar1 != 0) {
    fps = (double)(int)uVar2 / (double)(int)uVar1;
  }
  if ((fps != 0.0) || (NAN(fps))) {
    doubleToStr_abi_cxx11_(&local_38,&fps,-1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"not found",&local_39);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string VvcVpsUnit::getDescription() const
{
    string rez("Frame rate: ");
    const double fps = getFPS();
    if (fps != 0.0)
        rez += doubleToStr(fps);
    else
        rez += string("not found");

    return rez;
}